

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::Utils::getStringForVariableTypeValue_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,_variable_type type,uchar *data_ptr)

{
  TestError *this_00;
  undefined4 in_register_00000014;
  double *pdVar1;
  int iVar2;
  double dVar3;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  pdVar1 = (double *)CONCAT44(in_register_00000014,type);
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar2 = (int)this;
  if (iVar2 < 0x11) {
    if (iVar2 == 0) {
      std::ostream::_M_insert<bool>(SUB81(local_190,0));
      goto LAB_00933433;
    }
    if (iVar2 != 4) {
LAB_0093346d:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized variable type requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x4de);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    dVar3 = *pdVar1;
  }
  else {
    if (iVar2 != 0x11) {
      if (iVar2 == 0x12) {
        std::ostream::operator<<(local_190,(int)*(float *)pdVar1);
      }
      else {
        if (iVar2 != 0x1f) goto LAB_0093346d;
        std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      }
      goto LAB_00933433;
    }
    dVar3 = (double)*(float *)pdVar1;
  }
  std::ostream::_M_insert<double>(dVar3);
LAB_00933433:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getStringForVariableTypeValue(_variable_type type, const unsigned char* data_ptr)
{
	std::stringstream result_sstream;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result_sstream << *((bool*)data_ptr);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result_sstream << *((double*)data_ptr);
		break;
	case VARIABLE_TYPE_FLOAT:
		result_sstream << *((float*)data_ptr);
		break;
	case VARIABLE_TYPE_INT:
		result_sstream << *((int*)data_ptr);
		break;
	case VARIABLE_TYPE_UINT:
		result_sstream << *((unsigned int*)data_ptr);
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type requested");
	}
	} /* switch (type) */

	return result_sstream.str();
}